

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

sg_buffer sg_make_buffer(sg_buffer_desc *desc)

{
  sg_buffer buf_id_00;
  _sg_buffer_t *buf_00;
  _sg_buffer_t *buf;
  sg_buffer_desc desc_def;
  sg_buffer_desc *desc_local;
  sg_buffer buf_id;
  
  desc_def._88_8_ = desc;
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                  ,0x3f02,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
  }
  if (desc == (sg_buffer_desc *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                  ,0x3f03,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
  }
  _sg_buffer_desc_defaults((sg_buffer_desc *)&buf,desc);
  buf_id_00 = _sg_alloc_buffer();
  if (buf_id_00.id == 0) {
    _sg_log("buffer pool exhausted!");
  }
  else {
    buf_00 = _sg_buffer_at(&_sg.pools,buf_id_00.id);
    if ((buf_00 == (_sg_buffer_t *)0x0) || ((buf_00->slot).state != SG_RESOURCESTATE_ALLOC)) {
      __assert_fail("buf && (buf->slot.state == SG_RESOURCESTATE_ALLOC)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                    ,0x3f08,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
    }
    _sg_init_buffer(buf_00,(sg_buffer_desc *)&buf);
    if (((buf_00->slot).state != SG_RESOURCESTATE_VALID) &&
       ((buf_00->slot).state != SG_RESOURCESTATE_FAILED)) {
      __assert_fail("(buf->slot.state == SG_RESOURCESTATE_VALID) || (buf->slot.state == SG_RESOURCESTATE_FAILED)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                    ,0x3f0a,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
    }
  }
  return (sg_buffer)buf_id_00.id;
}

Assistant:

inline sg_buffer sg_make_buffer(const sg_buffer_desc& desc) { return sg_make_buffer(&desc); }